

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateLimiter.h
# Opt level: O3

bool __thiscall
jaegertracing::utils::RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::
checkCredit(RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> *this,
           double itemCost)

{
  double dVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  lVar3 = _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0 - (this->_lastTick).__d.__r;
  (this->_lastTick).__d.__r = _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0;
  dVar4 = ((double)lVar3 / 1000000000.0) * this->_creditsPerSecond + this->_balance;
  this->_balance = dVar4;
  dVar1 = this->_maxBalance;
  if ((this->_maxBalance < dVar4) || (dVar1 = dVar4, 1.0 <= dVar4)) {
    this->_balance =
         (double)(~-(ulong)(1.0 <= dVar1) & (ulong)dVar1 |
                 (ulong)(dVar1 + -1.0) & -(ulong)(1.0 <= dVar1));
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return 1.0 <= dVar1;
}

Assistant:

bool checkCredit(double itemCost)
    {
        std::lock_guard<std::mutex> lock(_mutex);
        const auto currentTime = Clock::now();
        const auto elapsedTime =
            std::chrono::duration<double>(currentTime - _lastTick);
        _lastTick = currentTime;

        _balance += elapsedTime.count() * _creditsPerSecond;
        if (_balance > _maxBalance) {
            _balance = _maxBalance;
        }

        if (_balance >= itemCost) {
            _balance -= itemCost;
            return true;
        }

        return false;
    }